

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

printable_vtable * __thiscall printable_vtable::operator=(printable_vtable *this)

{
  undefined1 local_40 [8];
  printable_vtable temp;
  printable_vtable *this_local;
  
  temp.value_ = this;
  printable_vtable<hi_printable>((printable_vtable *)local_40);
  std::swap<printable_vtable>((printable_vtable *)local_40,this);
  ~printable_vtable((printable_vtable *)local_40);
  return this;
}

Assistant:

printable_vtable & operator= (T value)
    {
        printable_vtable temp(std::move(value));
        std::swap(temp, *this);
        return *this;
    }